

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::ensureValidString
          (DOMLSSerializerImpl *this,DOMNode *nodeToWrite,XMLCh *string)

{
  XMLCh toCheck;
  bool bVar1;
  XMLCh *pXStack_28;
  XMLCh leadingSurrogate;
  XMLCh *cursor;
  XMLCh *string_local;
  DOMNode *nodeToWrite_local;
  DOMLSSerializerImpl *this_local;
  
  pXStack_28 = string;
  if (string != (XMLCh *)0x0) {
    for (; *pXStack_28 != L'\0'; pXStack_28 = pXStack_28 + 1) {
      if ((((this->fIsXml11 & 1U) != 0) &&
          (bVar1 = XMLChar1_1::isXMLChar(*pXStack_28,L'\0'), !bVar1)) ||
         (((this->fIsXml11 & 1U) == 0 && (bVar1 = XMLChar1_0::isXMLChar(*pXStack_28,L'\0'), !bVar1))
         )) {
        if (((ushort)*pXStack_28 < 0xd800) || (0xdbff < (ushort)*pXStack_28)) {
          reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
        }
        else {
          toCheck = *pXStack_28;
          pXStack_28 = pXStack_28 + 1;
          if (((*pXStack_28 == L'\0') ||
              (((this->fIsXml11 & 1U) != 0 &&
               (bVar1 = XMLChar1_1::isXMLChar(toCheck,*pXStack_28), !bVar1)))) ||
             (((this->fIsXml11 & 1U) == 0 &&
              (bVar1 = XMLChar1_0::isXMLChar(toCheck,*pXStack_28), !bVar1)))) {
            reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DOMLSSerializerImpl::ensureValidString(const DOMNode* nodeToWrite, const XMLCh* string)
{
    // XERCESC-1854: prevent illegal characters from being written
    // XERCESC-2130: allow surrogates
    if(string==0)
        return;
    const XMLCh* cursor=string;
    while(*cursor!=0)
    {
        if((fIsXml11 && !XMLChar1_1::isXMLChar(*cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(*cursor)))
        {
            if((*cursor >= 0xD800) && (*cursor <= 0xDBFF))
            {
                XMLCh leadingSurrogate = *cursor;
                cursor++;
                if(0==*cursor || (fIsXml11 && !XMLChar1_1::isXMLChar(leadingSurrogate, *cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(leadingSurrogate, *cursor)))
                {
                    reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
                    return; // leave if reportError does not throw
                }
            }
            else
            {
                reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
            }
        }
        cursor++;
    }
}